

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cc
# Opt level: O3

Token * __thiscall wabt::Token::operator=(Token *this,Token *other)

{
  TokenType TVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  size_type sVar8;
  size_type sVar9;
  pointer pcVar10;
  string *psVar11;
  
  Destroy(this);
  uVar2 = *(undefined4 *)&(other->loc).filename.data_;
  uVar3 = *(undefined4 *)((long)&(other->loc).filename.data_ + 4);
  sVar8 = (other->loc).filename.size_;
  uVar4 = *(undefined4 *)((long)&(other->loc).filename.size_ + 4);
  iVar5 = (other->loc).field_1.field_0.first_column;
  iVar6 = (other->loc).field_1.field_0.last_column;
  uVar7 = *(undefined4 *)((long)&(other->loc).field_1 + 0xc);
  (this->loc).field_1.field_0.line = (other->loc).field_1.field_0.line;
  (this->loc).field_1.field_0.first_column = iVar5;
  (this->loc).field_1.field_0.last_column = iVar6;
  *(undefined4 *)((long)&(this->loc).field_1 + 0xc) = uVar7;
  *(undefined4 *)&(this->loc).filename.data_ = uVar2;
  *(undefined4 *)((long)&(this->loc).filename.data_ + 4) = uVar3;
  *(int *)&(this->loc).filename.size_ = (int)sVar8;
  *(undefined4 *)((long)&(this->loc).filename.size_ + 4) = uVar4;
  TVar1 = other->token_type_;
  this->token_type_ = TVar1;
  if (TVar1 - First_Literal < 3) {
    (this->field_2).type_ = (other->field_2).type_;
    psVar11 = (string *)((long)&this->field_2 + 8);
    (this->field_2).text_._M_string_length = (size_type)((long)&this->field_2 + 0x18);
    pcVar10 = (pointer)(other->field_2).text_._M_string_length;
    sVar9 = (other->field_2).literal_.text._M_string_length;
LAB_00f512e6:
    std::__cxx11::string::_M_construct<char*>(psVar11,pcVar10,pcVar10 + sVar9);
  }
  else {
    if (0x33 < TVar1 - AtomicLoad) {
      if (TVar1 - AlignEqNat < 5) {
        psVar11 = (string *)&this->field_2;
        (this->field_2).text_._M_dataplus._M_p = (pointer)((long)&this->field_2 + 0x10);
        pcVar10 = (other->field_2).text_._M_dataplus._M_p;
        sVar9 = (other->field_2).text_._M_string_length;
        goto LAB_00f512e6;
      }
      if (TVar1 != First_Type) {
        return this;
      }
    }
    (this->field_2).type_ = (other->field_2).type_;
  }
  return this;
}

Assistant:

Token& Token::operator=(const Token& other) {
  Destroy();
  loc = other.loc;
  token_type_ = other.token_type_;

  if (HasLiteral()) {
    Construct(literal_, other.literal_);
  } else if (HasOpcode()) {
    Construct(opcode_, other.opcode_);
  } else if (HasText()) {
    Construct(text_, other.text_);
  } else if (HasType()) {
    Construct(type_, other.type_);
  }

  return *this;
}